

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.hpp
# Opt level: O2

void __thiscall
OpenMD::Quaternion<double>::toTwistSwing(Quaternion<double> *this,double *tw,double *sx,double *sy)

{
  double __x;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double local_38;
  double dStack_30;
  
  dVar3 = (this->super_Vector<double,_4U>).data_[0];
  dVar6 = (this->super_Vector<double,_4U>).data_[3];
  if ((1e-06 <= ABS(dVar6)) || (1e-06 <= ABS(dVar3))) {
    if (0.0 <= dVar3) {
      local_38 = (this->super_Vector<double,_4U>).data_[1];
      dStack_30 = (this->super_Vector<double,_4U>).data_[2];
    }
    else {
      dVar3 = -dVar3;
      local_38 = -(this->super_Vector<double,_4U>).data_[1];
      dStack_30 = -(this->super_Vector<double,_4U>).data_[2];
      dVar6 = -dVar6;
    }
    __x = atan2(dVar6,dVar3);
    dVar3 = atan2(SQRT(local_38 * local_38 + dStack_30 * dStack_30),
                  SQRT(dVar6 * dVar6 + dVar3 * dVar3));
    dVar6 = sin(dVar3);
    dVar1 = 0.0;
    dVar2 = 0.0;
    if (1e-06 <= ABS(dVar6)) {
      dVar1 = sin(__x);
      dVar2 = cos(__x);
      auVar4._8_8_ = dVar2 * local_38 + dVar1 * dStack_30;
      auVar4._0_8_ = dVar1 * -local_38 + dVar2 * dStack_30;
      auVar5._8_8_ = dVar6;
      auVar5._0_8_ = dVar6;
      auVar5 = divpd(auVar4,auVar5);
      dVar1 = auVar5._0_8_ + auVar5._0_8_;
      dVar2 = auVar5._8_8_ + auVar5._8_8_;
    }
    *tw = __x + __x;
    *sx = dVar2 * dVar3;
    *sy = dVar3 * dVar1;
  }
  else {
    *sy = 3.141592653589793;
    *sx = 3.141592653589793;
    *tw = 0.0;
  }
  return;
}

Assistant:

void toTwistSwing(Real& tw, Real& sx, Real& sy) {
      // First test if the swing is in the singularity:

      if (ISZERO(z(), tiny) && ISZERO(w(), tiny)) {
        sx = sy = Constants::PI;
        tw      = 0;
        return;
      }

      // Decompose into twist-swing by solving the equation:
      //
      //                       Qtwist(t*2) * Qswing(s*2) = q
      //
      // note: (x,y) is the normalized swing axis (x*x+y*y=1)
      //
      //          ( Ct 0 0 St ) * ( Cs xSs ySs 0 ) = ( qw qx qy qz )
      //  ( CtCs  xSsCt-yStSs  xStSs+ySsCt  StCs ) = ( qw qx qy qz )      (1)
      // From (1): CtCs / StCs = qw/qz => Ct/St = qw/qz => tan(t) = qz/qw (2)
      //
      // The swing rotation/2 s comes from:
      //
      // From (1): (CtCs)^2 + (StCs)^2 = qw^2 + qz^2 =>
      //                                       Cs = sqrt ( qw^2 + qz^2 ) (3)
      //
      // From (1): (xSsCt-yStSs)^2 + (xStSs+ySsCt)^2 = qx^2 + qy^2 =>
      //                                       Ss = sqrt ( qx^2 + qy^2 ) (4)
      // From (1):  |SsCt -StSs| |x| = |qx|
      //            |StSs +SsCt| |y|   |qy|                              (5)

      Real qw, qx, qy, qz;

      if (w() < 0) {
        qw = -w();
        qx = -x();
        qy = -y();
        qz = -z();
      } else {
        qw = w();
        qx = x();
        qy = y();
        qz = z();
      }

      Real t = atan2(qz, qw);  // from (2)
      Real s =
          atan2(sqrt(qx * qx + qy * qy), sqrt(qz * qz + qw * qw));  // from (3)
                                                                    // and (4)

      Real x = 0.0, y = 0.0, sins = sin(s);

      if (!ISZERO(sins, tiny)) {
        Real sint = sin(t);
        Real cost = cos(t);

        // by solving the linear system in (5):
        y = (-qx * sint + qy * cost) / sins;
        x = (qx * cost + qy * sint) / sins;
      }

      tw = (Real)2.0 * t;
      sx = (Real)2.0 * x * s;
      sy = (Real)2.0 * y * s;
    }